

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringConst(PrintExpressionContents *this,StringConst *curr)

{
  ostream *o;
  String *this_00;
  char *in_RCX;
  string_view str;
  string local_208 [32];
  undefined1 local_1e8 [16];
  size_t local_1c8;
  char *pcStack_1c0;
  undefined1 local_1b1;
  stringstream local_1b0 [7];
  bool valid;
  stringstream wtf8;
  ostream local_1a0 [376];
  string_view local_28;
  StringConst *local_18;
  StringConst *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (StringConst *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"string.const ");
  printMedium(o,local_28);
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c8 = (local_18->string).super_IString.str._M_len;
  pcStack_1c0 = (local_18->string).super_IString.str._M_str;
  local_1b1 = String::convertWTF16ToWTF8(local_1a0,(local_18->string).super_IString.str);
  if ((bool)local_1b1) {
    this_00 = (String *)this->o;
    std::__cxx11::stringstream::str();
    local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_208);
    str._M_len = local_1e8._8_8_;
    str._M_str = in_RCX;
    String::printEscaped(this_00,local_1e8._0_8_,str);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    return;
  }
  __assert_fail("valid",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9c2,"void wasm::PrintExpressionContents::visitStringConst(StringConst *)");
}

Assistant:

void visitStringConst(StringConst* curr) {
    printMedium(o, "string.const ");
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid =
      String::convertWTF16ToWTF8(wtf8, curr->string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    String::printEscaped(o, wtf8.str());
  }